

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,int attr)

{
  bool bVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  xmlChar *pxVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  long lStack_60;
  char buf [11];
  
  if (input != (xmlChar *)0x0) {
    if (doc == (xmlDocPtr)0x0) {
      bVar13 = false;
    }
    else {
      bVar13 = doc->type == XML_HTML_DOCUMENT_NODE;
    }
    pbVar12 = (byte *)0x3e8;
    pbVar3 = (byte *)(*xmlMalloc)(1000);
    if (pbVar3 != (byte *)0x0) {
      bVar1 = (bool)(attr != 0 & bVar13);
      pbVar11 = pbVar3;
LAB_00145023:
      do {
        bVar8 = *input;
        if (bVar8 == 0) {
          *pbVar3 = 0;
          return pbVar11;
        }
        if (pbVar12 < (byte *)(((long)pbVar3 - (long)pbVar11) + 100)) {
          if ((long)pbVar12 < 0) goto LAB_00145473;
          pbVar12 = (byte *)((long)pbVar12 * 2);
          pbVar4 = (byte *)(*xmlRealloc)(pbVar11,(size_t)pbVar12);
          if (pbVar4 == (byte *)0x0) goto LAB_00145473;
          pbVar3 = pbVar4 + ((long)pbVar3 - (long)pbVar11);
          bVar8 = *input;
          pbVar11 = pbVar4;
        }
        if (bVar8 == 0x26) {
          if (((bVar1) && (input[1] == 0x7b)) &&
             (pcVar6 = strchr((char *)input,0x7d), pcVar6 != (char *)0x0)) {
            bVar8 = 0x26;
            pbVar4 = pbVar3;
            while( true ) {
              input = input + 1;
              pbVar3 = pbVar4 + 1;
              if (bVar8 == 0x7d) break;
              *pbVar4 = bVar8;
              pbVar4 = pbVar11;
              if (pbVar12 < (byte *)(((long)pbVar3 - (long)pbVar11) + 100)) {
                if ((long)pbVar12 < 0) goto LAB_00145473;
                pbVar12 = (byte *)((long)pbVar12 * 2);
                pbVar4 = (byte *)(*xmlRealloc)(pbVar11,(size_t)pbVar12);
                if (pbVar4 == (byte *)0x0) goto LAB_00145473;
                pbVar3 = pbVar4 + ((long)pbVar3 - (long)pbVar11);
              }
              bVar8 = *input;
              pbVar11 = pbVar4;
              pbVar4 = pbVar3;
            }
            *pbVar4 = 0x7d;
          }
          else {
            pbVar3[0] = 0x26;
            pbVar3[1] = 0x61;
            pbVar3[2] = 0x6d;
            pbVar3[3] = 0x70;
            pbVar3[4] = 0x3b;
            pbVar3 = pbVar3 + 5;
LAB_00145213:
            input = input + 1;
          }
          goto LAB_00145023;
        }
        uVar9 = (uint)bVar8;
        if (uVar9 == 0x3e) {
          pbVar3[0] = 0x26;
          pbVar3[1] = 0x67;
          pbVar3[2] = 0x74;
          pbVar3[3] = 0x3b;
LAB_001451fd:
          pbVar3 = pbVar3 + 4;
          goto LAB_00145213;
        }
        if (uVar9 == 0x3c) {
          if ((((bVar1) && (input[1] == 0x21)) && (input[2] == 0x2d)) &&
             ((input[3] == 0x2d && (pbVar4 = xmlStrstr(input,"-->"), pbVar4 != (byte *)0x0)))) {
            while( true ) {
              lVar10 = 0;
              do {
                pbVar3[lVar10] = input[lVar10];
                if (input + lVar10 == pbVar4) {
                  pbVar3 = pbVar3 + lVar10 + 3;
                  pbVar3[-2] = input[lVar10 + 1];
                  pbVar3[-1] = input[lVar10 + 2];
                  input = input + lVar10 + 3;
                  goto LAB_00145023;
                }
                lVar2 = lVar10 - (long)pbVar11;
                lVar10 = lVar10 + 1;
              } while (pbVar3 + lVar2 + 0x65 <= pbVar12);
              if ((long)pbVar12 < 0) break;
              pbVar12 = (byte *)((long)pbVar12 * 2);
              pbVar5 = (byte *)(*xmlRealloc)(pbVar11,(size_t)pbVar12);
              if (pbVar5 == (byte *)0x0) break;
              input = input + lVar10;
              pbVar3 = pbVar5 + (long)(pbVar3 + (lVar10 - (long)pbVar11));
              pbVar11 = pbVar5;
            }
LAB_00145473:
            xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
            (*xmlFree)(pbVar11);
            return (xmlChar *)0x0;
          }
          pbVar3[0] = 0x26;
          pbVar3[1] = 0x6c;
          pbVar3[2] = 0x74;
          pbVar3[3] = 0x3b;
          goto LAB_001451fd;
        }
        if (('\x1f' < (char)bVar8) || ((bool)(bVar8 == 0xd & bVar13 | (byte)(bVar8 - 9) < 2)))
        goto LAB_001451ee;
        if (-1 < (char)bVar8) {
          if ((bVar8 < 0xe) && ((0x2600U >> (uVar9 & 0x1f) & 1) != 0)) {
            snprintf(buf,0xb,"&#%d;");
            buf[10] = '\0';
            for (lVar10 = 0; buf[lVar10] != 0; lVar10 = lVar10 + 1) {
              pbVar3[lVar10] = buf[lVar10];
            }
            pbVar3 = pbVar3 + lVar10;
          }
          goto LAB_00145213;
        }
        if (doc == (xmlDocPtr)0x0) {
          if (bVar13) goto LAB_001451ee;
        }
        else if (doc->encoding != (xmlChar *)0x0 || bVar13) {
LAB_001451ee:
          *pbVar3 = bVar8;
          pbVar3 = pbVar3 + 1;
          goto LAB_00145213;
        }
        if (bVar8 < 0xc0) {
          xmlEntitiesErr(XML_CHECK_NOT_UTF8,"xmlEncodeEntities: input not UTF-8");
          if (doc != (xmlDocPtr)0x0) {
            pxVar7 = xmlStrdup((xmlChar *)"ISO-8859-1");
            doc->encoding = pxVar7;
          }
          pbVar4 = (byte *)buf;
          snprintf((char *)pbVar4,0xb,"&#%d;",(ulong)*input);
          buf[10] = '\0';
          for (; *pbVar4 != 0; pbVar4 = pbVar4 + 1) {
            *pbVar3 = *pbVar4;
            pbVar3 = pbVar3 + 1;
          }
LAB_00145464:
          lStack_60 = 1;
        }
        else {
          if (0xdf < bVar8) {
            if (bVar8 < 0xf0) {
              uVar9 = (input[1] & 0x3f | (uVar9 & 0xf) << 6) << 6;
              lVar10 = 2;
              lStack_60 = 3;
              goto LAB_0014537c;
            }
            if (bVar8 < 0xf8) {
              uVar9 = (input[2] & 0x3f) << 6 | (input[1] & 0x3f | (uVar9 & 7) << 6) << 0xc;
              lVar10 = 3;
              lStack_60 = 4;
              goto LAB_0014537c;
            }
LAB_00145406:
            xmlEntitiesErr(XML_ERR_INVALID_CHAR,"xmlEncodeEntities: char out of range\n");
            if (doc != (xmlDocPtr)0x0) {
              pxVar7 = xmlStrdup((xmlChar *)"ISO-8859-1");
              doc->encoding = pxVar7;
            }
            pbVar4 = (byte *)buf;
            snprintf((char *)pbVar4,0xb,"&#%d;",(ulong)*input);
            buf[10] = '\0';
            for (; *pbVar4 != 0; pbVar4 = pbVar4 + 1) {
              *pbVar3 = *pbVar4;
              pbVar3 = pbVar3 + 1;
            }
            goto LAB_00145464;
          }
          uVar9 = (uVar9 & 0x1f) << 6;
          lVar10 = 1;
          lStack_60 = 2;
LAB_0014537c:
          uVar9 = input[lVar10] & 0x3f | uVar9;
          if (uVar9 < 0x100) {
            if ((uVar9 < 0x20) && ((0xd < uVar9 || ((0x2600U >> (input[lVar10] & 0x1f) & 1) == 0))))
            goto LAB_00145406;
          }
          else if (0xfffff < uVar9 - 0x10000 && (0x1ffd < uVar9 - 0xe000 && 0xd7ff < uVar9))
          goto LAB_00145406;
          pbVar4 = (byte *)buf;
          snprintf((char *)pbVar4,0xb,"&#x%X;",(ulong)uVar9);
          buf[10] = '\0';
          for (; *pbVar4 != 0; pbVar4 = pbVar4 + 1) {
            *pbVar3 = *pbVar4;
            pbVar3 = pbVar3 + 1;
          }
        }
        buf[10] = '\0';
        input = input + lStack_60;
      } while( true );
    }
    xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input, int attr) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    int html = 0;

    if (input == NULL) return(NULL);
    if (doc != NULL)
        html = (doc->type == XML_HTML_DOCUMENT_NODE);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size * sizeof(xmlChar));
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 100 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    const xmlChar *end;

	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if (html && attr &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
	        while (cur != end) {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		*out++ = *cur++;
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if (html && attr && (cur[1] == '{') &&
	        (strchr((const char *) cur, '}'))) {
	        while (*cur != '}') {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (((*cur >= 0x20) && (*cur < 0x80)) ||
	    (*cur == '\n') || (*cur == '\t') || ((html) && (*cur == '\r'))) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *cur;
	} else if (*cur >= 0x80) {
	    if (((doc != NULL) && (doc->encoding != NULL)) || (html)) {
		/*
		 * Bjørn Reese <br@sseusa.com> provided the patch
	        xmlChar xc;
	        xc = (*cur & 0x3F) << 6;
	        if (cur[1] != 0) {
		    xc += *(++cur) & 0x3F;
		    *out++ = xc;
	        } else
		 */
		*out++ = *cur;
	    } else {
		/*
		 * We assume we have UTF-8 input.
		 */
		char buf[11], *ptr;
		int val = 0, l = 1;

		if (*cur < 0xC0) {
		    xmlEntitiesErr(XML_CHECK_NOT_UTF8,
			    "xmlEncodeEntities: input not UTF-8");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		} else if (*cur < 0xE0) {
                    val = (cur[0]) & 0x1F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    l = 2;
		} else if (*cur < 0xF0) {
                    val = (cur[0]) & 0x0F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    l = 3;
		} else if (*cur < 0xF8) {
                    val = (cur[0]) & 0x07;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    val <<= 6;
		    val |= (cur[3]) & 0x3F;
		    l = 4;
		}
		if ((l == 1) || (!IS_CHAR(val))) {
		    xmlEntitiesErr(XML_ERR_INVALID_CHAR,
			"xmlEncodeEntities: char out of range\n");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		}
		/*
		 * We could do multiple things here. Just save as a char ref
		 */
		snprintf(buf, sizeof(buf), "&#x%X;", val);
		buf[sizeof(buf) - 1] = 0;
		ptr = buf;
		while (*ptr != 0) *out++ = *ptr++;
		cur += l;
		continue;
	    }
	} else if (IS_BYTE_CHAR(*cur)) {
	    char buf[11], *ptr;

	    snprintf(buf, sizeof(buf), "&#%d;", *cur);
	    buf[sizeof(buf) - 1] = 0;
            ptr = buf;
	    while (*ptr != 0) *out++ = *ptr++;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
    xmlFree(buffer);
    return(NULL);
}